

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.h
# Opt level: O1

void __thiscall Net::Train(Net *this)

{
  float fVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined8 uVar35;
  PointerType ptr;
  float *pfVar36;
  Matrix<float,_72,_64,_0,_72,_64> *pMVar37;
  Matrix<float,_64,_35,_0,_64,_35> *pMVar38;
  size_t i;
  ulong uVar39;
  float *pfVar40;
  Matrix<float,_64,_1,_0,_64,_1> *pMVar41;
  Matrix<float,_35,_1,_0,_35,_1> *pMVar42;
  long lVar43;
  size_t j;
  long lVar44;
  float fVar45;
  float fVar46;
  MatrixXf cur;
  DenseStorage<float,__1,__1,__1,_0> local_f8;
  Matrix<float,_64,_35,_0,_64,_35> *local_e0;
  XprType local_d8;
  undefined1 local_a8 [16];
  Matrix<float,_64,_1,_0,_64,_1> *local_98;
  variable_if_dynamic<long,__1> local_90;
  undefined8 local_88;
  Index IStack_80;
  XprType *local_78;
  block_evaluator<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true> local_60;
  block_evaluator<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true> local_50;
  XprType *local_40;
  XprType *local_38;
  
  local_f8.m_data = (float *)0x0;
  local_f8.m_rows = 0;
  local_f8.m_cols = 0;
  Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize(&local_f8,0x48,0xc,6);
  if (((XprType *)local_f8.m_rows != (XprType *)0xc) || (local_f8.m_cols != 6)) {
    Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize(&local_f8,0x48,0xc,6);
  }
  if (((XprType *)local_f8.m_rows != (XprType *)0xc) || (local_f8.m_cols != 6)) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2d1,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, -1>, SrcXprType = Eigen::Matrix<float, 12, 6>, T1 = float, T2 = float]"
                 );
  }
  uVar39 = 0xfffffffffffffffc;
  do {
    pfVar36 = (this->pool2).super_PlainObjectBase<Eigen::Matrix<float,_12,_6,_0,_12,_6>_>.m_storage.
              m_data.array + uVar39 + 4;
    uVar35 = *(undefined8 *)(pfVar36 + 2);
    *(undefined8 *)(local_f8.m_data + uVar39 + 4) = *(undefined8 *)pfVar36;
    *(undefined8 *)(local_f8.m_data + uVar39 + 4 + 2) = uVar35;
    uVar39 = uVar39 + 4;
  } while (uVar39 < 0x44);
  Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize(&local_f8,0x48,0x48,1);
  lVar44 = 0;
  pMVar37 = &this->v;
  do {
    if (local_f8.m_rows < 0 && local_f8.m_data != (float *)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/MapBase.h"
                    ,0xb0,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, Level = 0]"
                   );
    }
    if (local_f8.m_cols < 1) {
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/Block.h"
                    ,0x7a,
                    "Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                   );
    }
    if ((XprType *)local_f8.m_rows != (XprType *)0x48) {
      __assert_fail("size() == other.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/Dot.h"
                    ,0x52,
                    "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float, 72, 64>, 72, 1, true>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<Eigen::Matrix<float, 72, 64>, 72, 1, true>, OtherDerived = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                   );
    }
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_startRow.
    m_value = 0;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_outerStride
         = 0x48;
    local_a8._0_8_ = local_f8.m_data;
    local_a8._8_8_ = local_f8.m_rows;
    local_88 = 0;
    IStack_80 = 0;
    local_78 = (XprType *)local_f8.m_rows;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_0>.m_data =
         (PointerType)pMVar37;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_xpr =
         (XprTypeNested)&this->v;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_startCol.
    m_value = lVar44;
    local_90.m_value = (long)&local_f8;
    Eigen::internal::block_evaluator<Eigen::Matrix<float,_72,_64,_0,_72,_64>,_72,_1,_true,_true>::
    block_evaluator((block_evaluator<Eigen::Matrix<float,_72,_64,_0,_72,_64>,_72,_1,_true,_true> *)
                    &local_60,(XprType *)&local_d8);
    local_50.
    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
    .m_data = (PointerType)local_a8._0_8_;
    local_40 = local_78;
    local_38 = &local_d8;
    dVar2 = exp(-((double)(*(float *)(local_a8._0_8_ + 0x11c) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x47] +
                           *(float *)(local_a8._0_8_ + 0x10c) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x43] +
                           *(float *)(local_a8._0_8_ + 0xfc) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x3f] +
                           *(float *)(local_a8._0_8_ + 0xec) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x3b] +
                           *(float *)(local_a8._0_8_ + 0xdc) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x37] +
                           *(float *)(local_a8._0_8_ + 0xcc) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x33] +
                           *(float *)(local_a8._0_8_ + 0xbc) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x2f] +
                           *(float *)(local_a8._0_8_ + 0xac) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x2b] +
                           *(float *)(local_a8._0_8_ + 0x9c) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x27] +
                           *(float *)(local_a8._0_8_ + 0x8c) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x23] +
                           *(float *)(local_a8._0_8_ + 0x7c) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x1f] +
                           *(float *)(local_a8._0_8_ + 0x6c) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x1b] +
                           *(float *)(local_a8._0_8_ + 0x5c) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x17] +
                           *(float *)(local_a8._0_8_ + 0x4c) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x13] +
                           *(float *)(local_a8._0_8_ + 0x3c) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0xf] +
                           *(float *)(local_a8._0_8_ + 0x2c) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0xb] +
                           *(float *)(local_a8._0_8_ + 0x1c) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[7] +
                           *(float *)(local_a8._0_8_ + 0xc) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[3] +
                           *(float *)(local_a8._0_8_ + 0x114) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x45] +
                           *(float *)(local_a8._0_8_ + 0x104) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x41] +
                           *(float *)(local_a8._0_8_ + 0xf4) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x3d] +
                           *(float *)(local_a8._0_8_ + 0xe4) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x39] +
                           *(float *)(local_a8._0_8_ + 0xd4) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x35] +
                           *(float *)(local_a8._0_8_ + 0xc4) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x31] +
                           *(float *)(local_a8._0_8_ + 0xb4) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x2d] +
                           *(float *)(local_a8._0_8_ + 0xa4) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x29] +
                           *(float *)(local_a8._0_8_ + 0x94) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x25] +
                           *(float *)(local_a8._0_8_ + 0x84) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x21] +
                           *(float *)(local_a8._0_8_ + 0x74) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x1d] +
                           *(float *)(local_a8._0_8_ + 100) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x19] +
                           *(float *)(local_a8._0_8_ + 0x54) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x15] +
                           *(float *)(local_a8._0_8_ + 0x44) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x11] +
                           *(float *)(local_a8._0_8_ + 0x34) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0xd] +
                           *(float *)(local_a8._0_8_ + 0x24) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[9] +
                           *(float *)(local_a8._0_8_ + 0x14) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[5] +
                           *(float *)(local_a8._0_8_ + 4) *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[1] +
                          *(float *)(local_a8._0_8_ + 0x118) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x46] +
                          *(float *)(local_a8._0_8_ + 0x108) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x42] +
                          *(float *)(local_a8._0_8_ + 0xf8) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x3e] +
                          *(float *)(local_a8._0_8_ + 0xe8) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x3a] +
                          *(float *)(local_a8._0_8_ + 0xd8) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x36] +
                          *(float *)(local_a8._0_8_ + 200) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x32] +
                          *(float *)(local_a8._0_8_ + 0xb8) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x2e] +
                          *(float *)(local_a8._0_8_ + 0xa8) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x2a] +
                          *(float *)(local_a8._0_8_ + 0x98) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x26] +
                          *(float *)(local_a8._0_8_ + 0x88) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x22] +
                          *(float *)(local_a8._0_8_ + 0x78) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x1e] +
                          *(float *)(local_a8._0_8_ + 0x68) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x1a] +
                          *(float *)(local_a8._0_8_ + 0x58) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x16] +
                          *(float *)(local_a8._0_8_ + 0x48) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x12] +
                          *(float *)(local_a8._0_8_ + 0x38) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0xe] +
                          *(float *)(local_a8._0_8_ + 0x28) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[10] +
                          *(float *)(local_a8._0_8_ + 0x18) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[6] +
                          *(float *)(local_a8._0_8_ + 8) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[2] +
                          *(float *)(local_a8._0_8_ + 0x110) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x44] +
                          *(float *)(local_a8._0_8_ + 0x100) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x40] +
                          *(float *)(local_a8._0_8_ + 0xf0) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x3c] +
                          *(float *)(local_a8._0_8_ + 0xe0) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x38] +
                          *(float *)(local_a8._0_8_ + 0xd0) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x34] +
                          *(float *)(local_a8._0_8_ + 0xc0) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x30] +
                          *(float *)(local_a8._0_8_ + 0xb0) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x2c] +
                          *(float *)(local_a8._0_8_ + 0xa0) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x28] +
                          *(float *)(local_a8._0_8_ + 0x90) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x24] +
                          *(float *)(local_a8._0_8_ + 0x80) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x20] +
                          *(float *)(local_a8._0_8_ + 0x70) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x1c] +
                          *(float *)(local_a8._0_8_ + 0x60) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x18] +
                          *(float *)(local_a8._0_8_ + 0x50) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x14] +
                          *(float *)(local_a8._0_8_ + 0x40) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x10] +
                          *(float *)(local_a8._0_8_ + 0x30) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0xc] +
                          *(float *)(local_a8._0_8_ + 0x20) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[8] +
                          *(float *)(local_a8._0_8_ + 0x10) *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[4] +
                          *(float *)local_a8._0_8_ *
                          *local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data) -
                 (double)(this->r).super_PlainObjectBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>_>.
                         m_storage.m_data.array[lVar44]));
    (this->b).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
    [lVar44] = (float)(1.0 / (dVar2 + 1.0));
    lVar44 = lVar44 + 1;
    pMVar37 = (Matrix<float,_72,_64,_0,_72,_64> *)
              ((pMVar37->super_PlainObjectBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>_>).m_storage.
               m_data.array + 0x48);
  } while (lVar44 != 0x40);
  pMVar38 = &this->w;
  lVar44 = 0;
  local_e0 = pMVar38;
  do {
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_xpr =
         local_e0;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_startRow.
    m_value = 0;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_outerStride
         = 0x40;
    local_90.m_value = 0;
    IStack_80 = 0x40;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_0>.m_data =
         (PointerType)pMVar38;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_startCol.
    m_value = lVar44;
    local_a8._0_8_ = &this->b;
    local_98 = &this->b;
    Eigen::internal::block_evaluator<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>::
    block_evaluator(&local_60,&local_d8);
    Eigen::internal::block_evaluator<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>::
    block_evaluator(&local_50,(XprType *)local_a8);
    local_40 = &local_d8;
    dVar2 = exp((double)(local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x3f] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x3f] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x3b] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x3b] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x37] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x37] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x33] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x33] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x2f] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x2f] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x2b] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x2b] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x27] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x27] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x23] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x23] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x1f] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x1f] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x1b] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x1b] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x17] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x17] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x13] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x13] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0xf] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0xf] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0xb] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0xb] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[7] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[7] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[3] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[3] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x3d] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x3d] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x39] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x39] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x35] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x35] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x31] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x31] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x2d] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x2d] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x29] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x29] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x25] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x25] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x21] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x21] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x1d] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x1d] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x19] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x19] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x15] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x15] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x11] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x11] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0xd] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0xd] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[9] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[9] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[5] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[5] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[1] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[1] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x3e] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x3e] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x3a] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x3a] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x36] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x36] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x32] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x32] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x2e] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x2e] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x2a] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x2a] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x26] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x26] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x22] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x22] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x1e] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x1e] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x1a] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x1a] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x16] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x16] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x12] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x12] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0xe] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0xe] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[10] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[10] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[6] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[6] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[2] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[2] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x3c] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x3c] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x38] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x38] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x34] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x34] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x30] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x30] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x2c] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x2c] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x28] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x28] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x24] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x24] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x20] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x20] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x1c] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x1c] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x18] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x18] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x14] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x14] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x10] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x10] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0xc] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0xc] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[8] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[8] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[4] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[4] +
                        *local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data *
                        *local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data) -
                (double)(this->o).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.
                        m_storage.m_data.array[lVar44]);
    (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.array
    [lVar44] = (float)dVar2;
    lVar44 = lVar44 + 1;
    pMVar38 = (Matrix<float,_64,_35,_0,_64,_35> *)
              ((pMVar38->super_PlainObjectBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>).m_storage.
               m_data.array + 0x40);
  } while (lVar44 != 0x23);
  fVar3 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
          array[0];
  fVar4 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
          array[1];
  fVar5 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
          array[2];
  fVar6 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
          array[3];
  fVar7 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
          array[4];
  fVar8 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
          array[5];
  fVar9 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
          array[6];
  fVar10 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[7];
  fVar11 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[8];
  fVar12 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[9];
  fVar13 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[10];
  fVar14 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0xb];
  fVar15 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0xc];
  fVar16 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0xd];
  fVar17 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0xe];
  fVar18 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0xf];
  fVar19 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x10];
  fVar20 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x11];
  fVar21 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x12];
  fVar22 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x13];
  fVar23 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x14];
  fVar24 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x15];
  fVar25 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x16];
  fVar26 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x17];
  fVar27 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x18];
  fVar28 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x19];
  fVar29 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x1a];
  fVar30 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x1b];
  fVar31 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x1c];
  fVar32 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x1d];
  fVar33 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x1e];
  fVar34 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x1f];
  fVar45 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x21];
  fVar46 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x22];
  fVar1 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
          array[0x20];
  lVar44 = 0;
  do {
    (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.array
    [lVar44] = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.
               m_data.array[lVar44] /
               (fVar45 + fVar46 + fVar1 +
               fVar34 + fVar30 + fVar26 + fVar22 + fVar18 + fVar14 + fVar10 + fVar6 +
               fVar32 + fVar28 + fVar24 + fVar20 + fVar16 + fVar12 + fVar8 + fVar4 +
               fVar33 + fVar29 + fVar25 + fVar21 + fVar17 + fVar13 + fVar9 + fVar5 +
               fVar31 + fVar27 + fVar23 + fVar19 + fVar15 + fVar11 + fVar7 + fVar3);
    lVar44 = lVar44 + 1;
  } while (lVar44 != 0x23);
  this->ek = 0.0;
  lVar44 = -0x8c;
  do {
    fVar45 = *(float *)((long)(this->yc).
                              super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.
                              m_storage.m_data.array + lVar44);
    local_e0 = (Matrix<float,_64,_35,_0,_64,_35> *)CONCAT44(local_e0._4_4_,fVar45);
    fVar46 = *(float *)((long)&this->ek + lVar44);
    *(float *)((long)(this->e).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.
                     m_storage.m_data.array + lVar44 + -8) = fVar46 - fVar45;
    fVar45 = logf(fVar46);
    this->ek = this->ek - (double)(fVar45 * local_e0._0_4_);
    lVar44 = lVar44 + 4;
  } while (lVar44 != 0);
  fVar45 = (this->g).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
           array[0];
  pfVar36 = (this->w).super_PlainObjectBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>.m_storage.
            m_data.array + 0x40;
  lVar44 = 0;
  do {
    fVar46 = (this->w).super_PlainObjectBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>.m_storage.
             m_data.array[lVar44] * fVar45;
    lVar43 = 0;
    pfVar40 = (this->g).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.
              m_data.array;
    do {
      pfVar40 = (float *)((long)pfVar40 + 4);
      fVar46 = fVar46 + pfVar36[lVar43] * *pfVar40;
      lVar43 = lVar43 + 0x40;
    } while (lVar43 != 0x880);
    fVar1 = (this->b).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.m_storage.m_data
            .array[lVar44];
    (this->e).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
    [lVar44] = fVar46 * (1.0 - fVar1) * fVar1;
    lVar44 = lVar44 + 1;
    pfVar36 = pfVar36 + 1;
  } while (lVar44 != 0x40);
  pMVar37 = &this->v;
  lVar44 = 0;
  do {
    lVar43 = 0;
    pMVar41 = &this->e;
    do {
      (pMVar37->super_PlainObjectBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>_>).m_storage.m_data.
      array[lVar43] =
           (pMVar41->super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>).m_storage.m_data
           .array[0] * -0.3 *
           (this->x).super_PlainObjectBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>_>.m_storage.m_data.
           array[lVar44] +
           (pMVar37->super_PlainObjectBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>_>).m_storage.
           m_data.array[lVar43];
      lVar43 = lVar43 + 0x48;
      pMVar41 = (Matrix<float,_64,_1,_0,_64,_1> *)
                ((pMVar41->super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>).m_storage.
                 m_data.array + 1);
    } while (lVar43 != 0x1200);
    lVar44 = lVar44 + 1;
    pMVar37 = (Matrix<float,_72,_64,_0,_72,_64> *)
              ((pMVar37->super_PlainObjectBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>_>).m_storage.
               m_data.array + 1);
  } while (lVar44 != 0x48);
  pMVar38 = &this->w;
  lVar44 = 0;
  do {
    lVar43 = 0;
    pMVar42 = &this->g;
    do {
      (pMVar38->super_PlainObjectBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>).m_storage.m_data.
      array[lVar43] =
           (pMVar42->super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).m_storage.m_data
           .array[0] * -0.4 *
           (this->b).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.m_storage.m_data.
           array[lVar44] +
           (pMVar38->super_PlainObjectBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>).m_storage.
           m_data.array[lVar43];
      lVar43 = lVar43 + 0x40;
      pMVar42 = (Matrix<float,_35,_1,_0,_35,_1> *)
                ((pMVar42->super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).m_storage.
                 m_data.array + 1);
    } while (lVar43 != 0x8c0);
    lVar44 = lVar44 + 1;
    pMVar38 = (Matrix<float,_64,_35,_0,_64,_35> *)
              ((pMVar38->super_PlainObjectBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>).m_storage.
               m_data.array + 1);
  } while (lVar44 != 0x40);
  lVar44 = 0;
  do {
    (this->r).super_PlainObjectBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>_>.m_storage.m_data.array
    [lVar44] = (this->e).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.m_storage.
               m_data.array[lVar44] * -0.3 +
               (this->r).super_PlainObjectBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>_>.m_storage.
               m_data.array[lVar44];
    lVar44 = lVar44 + 1;
  } while (lVar44 != 0x40);
  lVar44 = -0x8c;
  do {
    *(float *)((long)(this->g).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.
                     m_storage.m_data.array + lVar44) =
         *(float *)((long)(this->e).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.
                          m_storage.m_data.array + lVar44 + -8) * -0.4 +
         *(float *)((long)(this->g).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.
                          m_storage.m_data.array + lVar44);
    lVar44 = lVar44 + 4;
  } while (lVar44 != 0);
  free(local_f8.m_data);
  return;
}

Assistant:

void Net::Train()
{
    //pool2.normalize();// use sigmod for hidden layer
    MatrixXf cur = pool2;
    cur.resize(D,1);

    /* Compute b[h], hidden layer output */
    for (size_t h = 0; h < Q; h++) {
        double alpha_h = v.col(h).dot(cur.col(0));
//        double alpha_h = 0;
//        for (size_t i = 0; i < D; i++)
//            alpha_h += v(i,h) * cur(i,0);
        b(h,0) = ACTIVE(alpha_h - r(h,0));
    }

    /* Compute yc[j] ,output layer output */
    for (size_t j = 0; j < L; j++) {
        double beta_j = 0;
        beta_j = w.col(j).dot(b.col(0));
//        for (size_t h = 0; h < Q; h++)
//            beta_j += w[h][j] * b[h];
        yc(j,0) = exp(beta_j - o(j,0));
    }
    /*softmax activation*/
    float SUM = yc.sum();
    for (size_t j = 0; j < L; j++)
    {
        yc(j,0) = yc(j,0)/SUM;
    }

    ek = 0;

    /* Compute g[j] and E ,g[i] is the output layer point loss, Ek is the output layer loss*/
    for (size_t j = 0; j < L; j++) {
        g[j] =  (yc[j] - y[j]);// update b for output layer, when update the b, plus g
        ek -= y[j]*log(yc[j]); //
    }

    /* Compute e[h] , e[h] is the hidden layer loss*/
    for (size_t h = 0; h < Q; h++) {
        double temp = 0;
        temp = w.row(h).dot(g);
        e[h] = b[h] * (1 - b[h]) * temp;
    }

    /* Update v[i][h], w[h][j], r[h], o[j] */
    for (size_t i = 0; i < D; i++)
        for (size_t h = 0; h < Q; h++)
            v(i,h) -= LEARN_RATE1 * e[h] * x[i];
    for (size_t h = 0; h < Q; h++)
        for (size_t j = 0; j < L; j++)
            w(h,j) -= LEARN_RATE2 * g[j] * b[h];

    for (size_t h = 0; h < Q; h++)
        r[h] -= ((LEARN_RATE1) * e[h]);

    for (size_t j = 0; j < L; j++)
        o[j] -= ((LEARN_RATE2) * g[j]);
}